

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1900.c
# Opt level: O2

int test(char *URL)

{
  uint uVar1;
  uint __i;
  int iVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  int *piVar5;
  CURL *pCVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  int i;
  long lVar11;
  long lVar12;
  CURL **ppCVar13;
  ulong uVar14;
  ulong uVar15;
  timeval tVar16;
  timeval older;
  int local_30c;
  int maxfd;
  int running;
  __suseconds_t local_300;
  __time_t local_2f8;
  long timeout;
  timeval local_2e8;
  __suseconds_t local_2d8;
  __time_t local_2d0;
  char *local_2c8;
  int msgs_left;
  int filetime;
  fd_set exc;
  fd_set wr;
  char local_138 [264];
  
  num_handles = 0;
  blacklist_num_sites = 0;
  __stream = fopen64(libtest_arg2,"rb");
  if (__stream != (FILE *)0x0) {
    local_2c8 = URL;
    while (iVar2 = feof(__stream), iVar2 == 0) {
      iVar3 = __isoc99_fscanf(__stream,"%d %s\n",&filetime,local_138);
      iVar2 = num_handles;
      if (iVar3 == 0) {
        iVar2 = __isoc99_fscanf(__stream,"blacklist_site %s\n",local_138);
        if (iVar2 == 0) break;
        pcVar4 = strdup(local_138);
        iVar2 = blacklist_num_sites;
        site_blacklist[blacklist_num_sites] = pcVar4;
        piVar5 = &blacklist_num_sites;
      }
      else {
        lVar12 = (long)num_handles;
        urltime[lVar12] = filetime;
        pcVar4 = strdup(local_138);
        urlstring[lVar12] = pcVar4;
        piVar5 = &num_handles;
      }
      *piVar5 = iVar2 + 1;
    }
    fclose(__stream);
    site_blacklist[blacklist_num_sites] = (char *)0x0;
    server_blacklist[0] = (char *)0x0;
    if (0 < num_handles) {
      tv_test_start = tutil_tvnow();
      curl_global_init(3);
      lVar12 = curl_multi_init();
      if (lVar12 == 0) {
        lVar12 = 0;
        curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                      ,0x98);
        iVar2 = 0x7b;
      }
      else {
        ppCVar13 = handles;
        for (lVar11 = 0; lVar11 < num_handles; lVar11 = lVar11 + 1) {
          pCVar6 = (CURL *)curl_easy_init();
          *ppCVar13 = pCVar6;
          ppCVar13 = ppCVar13 + 1;
        }
        iVar2 = curl_multi_setopt(lVar12,3,1);
        uVar9 = _stderr;
        if (iVar2 == 0) {
          iVar2 = curl_multi_setopt(lVar12,7,2);
          uVar9 = _stderr;
          if (iVar2 == 0) {
            iVar2 = curl_multi_setopt(lVar12,8,3);
            uVar9 = _stderr;
            if (iVar2 == 0) {
              iVar2 = curl_multi_setopt(lVar12,0x7539,15000);
              uVar9 = _stderr;
              if (iVar2 == 0) {
                iVar2 = curl_multi_setopt(lVar12,0x753a,10000);
                uVar9 = _stderr;
                if (iVar2 == 0) {
                  iVar2 = curl_multi_setopt(lVar12,0x271b,site_blacklist);
                  uVar9 = _stderr;
                  if (iVar2 == 0) {
                    iVar2 = curl_multi_setopt(lVar12,0x271c,server_blacklist);
                    uVar9 = _stderr;
                    if (iVar2 == 0) {
                      tVar16 = tutil_tvnow();
                      local_30c = 0;
                      do {
                        local_300 = tVar16.tv_usec;
                        local_2f8 = tVar16.tv_sec;
                        local_2e8.tv_sec = 1;
                        local_2e8.tv_usec = 0;
                        maxfd = -99;
                        if (local_30c < num_handles) {
                          tVar16 = tutil_tvnow();
                          local_2d8 = tVar16.tv_usec;
                          local_2d0 = tVar16.tv_sec;
                          older.tv_usec = local_300;
                          older.tv_sec = local_2f8;
                          lVar11 = tutil_tvdiff(tVar16,older);
                          tVar16.tv_usec = local_300;
                          tVar16.tv_sec = local_2f8;
                          if (urltime[local_30c] <= lVar11) {
                            curl_mfprintf(_stdout,"Adding handle %d\n");
                            curl_msnprintf(local_138,0x100,"%s%s",local_2c8,urlstring[local_30c]);
                            curl_easy_setopt(handles[local_30c],0x2712,local_138);
                            curl_easy_setopt(handles[local_30c],0x29,1);
                            curl_easy_setopt(handles[local_30c],0x2d,1);
                            curl_easy_setopt(handles[local_30c],0x4e2b,write_callback);
                            curl_easy_setopt(handles[local_30c],0x2711,0);
                            curl_multi_add_handle(lVar12,handles[local_30c]);
                            local_30c = local_30c + 1;
                            tVar16.tv_usec = local_2d8;
                            tVar16.tv_sec = local_2d0;
                          }
                        }
                        local_300 = tVar16.tv_usec;
                        local_2f8 = tVar16.tv_sec;
                        curl_multi_perform(lVar12,&running);
                        tVar16 = tutil_tvnow();
                        lVar11 = tutil_tvdiff(tVar16,tv_test_start);
                        if (60000 < lVar11) {
                          uVar9 = 0xbd;
                          goto LAB_00102abc;
                        }
                        while( true ) {
                          piVar5 = (int *)curl_multi_info_read(lVar12,&msgs_left);
                          if (piVar5 == (int *)0x0) break;
                          if (*piVar5 == 1) {
                            uVar1 = num_handles;
                            if (num_handles < 1) {
                              uVar1 = 0;
                            }
                            uVar10 = (ulong)uVar1;
                            ppCVar13 = handles;
                            for (uVar14 = 0; uVar15 = uVar10, uVar10 != uVar14; uVar14 = uVar14 + 1)
                            {
                              if (*(CURL **)(piVar5 + 2) == *ppCVar13) {
                                uVar10 = uVar14 & 0xffffffff;
                                uVar15 = uVar14;
                                break;
                              }
                              ppCVar13 = ppCVar13 + 1;
                            }
                            curl_mprintf("Handle %d Completed with status %d\n",uVar10,piVar5[4]);
                            curl_multi_remove_handle(lVar12,handles[uVar15]);
                          }
                        }
                        if ((local_30c == num_handles) && (running == 0)) goto LAB_00102476;
                        for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
                          (&filetime + lVar11 * 2)[0] = 0;
                          (&filetime + lVar11 * 2)[1] = 0;
                        }
                        for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
                          wr.__fds_bits[lVar11] = 0;
                        }
                        for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
                          exc.__fds_bits[lVar11] = 0;
                        }
                        curl_multi_fdset(lVar12,(fd_set *)&filetime,&wr,&exc,&maxfd);
                        curl_multi_timeout(lVar12,&timeout);
                        if (timeout < 0) {
                          timeout = 1;
                        }
                        local_2e8.tv_sec = 0;
                        local_2e8.tv_usec = 1000;
                        iVar2 = select_wrapper(maxfd + 1,(fd_set *)&filetime,&wr,&exc,&local_2e8);
                        if (iVar2 == -1) {
                          piVar5 = __errno_location();
                          uVar9 = _stderr;
                          iVar2 = *piVar5;
                          pcVar4 = strerror(iVar2);
                          curl_mfprintf(uVar9,"%s:%d select() failed, with errno %d (%s)\n",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                                        ,0xe8,iVar2,pcVar4);
                          iVar2 = 0x79;
                          goto LAB_00102696;
                        }
                        tVar16 = tutil_tvnow();
                        lVar11 = tutil_tvdiff(tVar16,tv_test_start);
                        tVar16.tv_usec = local_300;
                        tVar16.tv_sec = local_2f8;
                      } while (lVar11 < 0xea61);
                      uVar9 = 0xea;
LAB_00102abc:
                      curl_mfprintf(_stderr,
                                    "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                    ,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                                    ,uVar9);
                      iVar2 = 0x7d;
                      goto LAB_00102696;
                    }
                    uVar7 = curl_multi_strerror(iVar2);
                    uVar8 = 0xa3;
                  }
                  else {
                    uVar7 = curl_multi_strerror(iVar2);
                    uVar8 = 0xa2;
                  }
                }
                else {
                  uVar7 = curl_multi_strerror(iVar2);
                  uVar8 = 0xa0;
                }
              }
              else {
                uVar7 = curl_multi_strerror(iVar2);
                uVar8 = 0x9f;
              }
            }
            else {
              uVar7 = curl_multi_strerror(iVar2);
              uVar8 = 0x9e;
            }
          }
          else {
            uVar7 = curl_multi_strerror(iVar2);
            uVar8 = 0x9d;
          }
        }
        else {
          uVar7 = curl_multi_strerror(iVar2);
          uVar8 = 0x9c;
        }
        curl_mfprintf(uVar9,"%s:%d curl_multi_setopt() failed, with code %d (%s)\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/macressler[P]curl/tests/libtest/lib1900.c"
                      ,uVar8,iVar2,uVar7);
      }
      goto LAB_00102696;
    }
  }
  lVar12 = 0;
LAB_00102476:
  iVar2 = 0;
LAB_00102696:
  ppCVar13 = handles;
  iVar3 = num_handles;
  for (lVar11 = 0; lVar11 < iVar3; lVar11 = lVar11 + 1) {
    if (*ppCVar13 != (CURL *)0x0) {
      curl_easy_cleanup();
      iVar3 = num_handles;
    }
    ppCVar13 = ppCVar13 + 1;
  }
  curl_multi_cleanup(lVar12);
  curl_global_cleanup();
  uVar14 = 0;
  uVar10 = (ulong)(uint)num_handles;
  if (num_handles < 1) {
    uVar10 = uVar14;
  }
  for (; uVar10 * 8 != uVar14; uVar14 = uVar14 + 8) {
    free(*(void **)((long)urlstring + uVar14));
    *(undefined8 *)((long)urlstring + uVar14) = 0;
  }
  uVar14 = 0;
  uVar10 = (ulong)(uint)blacklist_num_sites;
  if (blacklist_num_sites < 1) {
    uVar10 = uVar14;
  }
  while( true ) {
    if (uVar10 * 8 == uVar14) break;
    free(*(void **)((long)site_blacklist + uVar14));
    *(undefined8 *)((long)site_blacklist + uVar14) = 0;
    uVar14 = uVar14 + 8;
  }
  return iVar2;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURLM *m = NULL;
  CURLMsg *msg; /* for picking up messages with the transfer status */
  int msgs_left; /* how many messages are left */
  int running;
  int handlenum = 0;
  struct timeval last_handle_add;

  if(parse_url_file(libtest_arg2) <= 0)
    goto test_cleanup;

  start_test_timing();

  curl_global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  create_handles();

  multi_setopt(m, CURLMOPT_PIPELINING, 1L);
  multi_setopt(m, CURLMOPT_MAX_HOST_CONNECTIONS, 2L);
  multi_setopt(m, CURLMOPT_MAX_PIPELINE_LENGTH, 3L);
  multi_setopt(m, CURLMOPT_CONTENT_LENGTH_PENALTY_SIZE, 15000L);
  multi_setopt(m, CURLMOPT_CHUNK_LENGTH_PENALTY_SIZE, 10000L);

  multi_setopt(m, CURLMOPT_PIPELINING_SITE_BL, site_blacklist);
  multi_setopt(m, CURLMOPT_PIPELINING_SERVER_BL, server_blacklist);

  last_handle_add = tutil_tvnow();

  for(;;) {
    struct timeval interval;
    struct timeval now;
    fd_set rd, wr, exc;
    int maxfd = -99;
    long timeout;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    if(handlenum < num_handles) {
      now = tutil_tvnow();
      if(tutil_tvdiff(now, last_handle_add) >= urltime[handlenum]) {
        fprintf(stdout, "Adding handle %d\n", handlenum);
        setup_handle(URL, m, handlenum);
        last_handle_add = now;
        handlenum++;
      }
    }

    curl_multi_perform(m, &running);

    abort_on_test_timeout();

    /* See how the transfers went */
    do {
      msg = curl_multi_info_read(m, &msgs_left);
      if(msg && msg->msg == CURLMSG_DONE) {
        int i, found = 0;

        /* Find out which handle this message is about */
        for(i = 0; i < num_handles; i++) {
          found = (msg->easy_handle == handles[i]);
          if(found)
            break;
        }

        printf("Handle %d Completed with status %d\n", i, msg->data.result);
        curl_multi_remove_handle(m, handles[i]);
      }
    } while(msg);

    if(handlenum == num_handles && !running) {
      break; /* done */
    }

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    curl_multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    curl_multi_timeout(m, &timeout);

    if(timeout < 0)
      timeout = 1;

    interval.tv_sec = timeout / 1000;
    interval.tv_usec = (timeout % 1000) * 1000;

    interval.tv_sec = 0;
    interval.tv_usec = 1000;

    select_test(maxfd + 1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  remove_handles();

  /* undocumented cleanup sequence - type UB */

  curl_multi_cleanup(m);
  curl_global_cleanup();

  free_urls();
  return res;
}